

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt.hpp
# Opt level: O0

p_range * __thiscall dna_bwt<dna_string>::LF(dna_bwt<dna_string> *this,range_t rn)

{
  ulong in_RCX;
  ulong in_RDX;
  p_rank *in_RSI;
  p_range *in_RDI;
  p_rank r;
  p_rank l;
  p_rank f;
  p_rank end;
  p_rank start;
  p_rank local_d8;
  p_rank local_b8;
  p_rank local_98;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t in_stack_ffffffffffffffb8;
  dna_string *in_stack_ffffffffffffffc0;
  p_rank local_38;
  ulong local_10;
  ulong local_8;
  
  local_10 = in_RDX;
  local_8 = in_RCX;
  dna_string::parallel_rank(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (local_10 < local_8) {
    dna_string::parallel_rank(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_58 = local_78;
    local_50 = local_70;
  }
  else {
    local_58 = local_38.A;
    local_50 = local_38.C;
  }
  local_98.A = in_RSI->G;
  local_98.C = in_RSI->T;
  local_98.G = in_RSI[1].A;
  local_98.T = in_RSI[1].C;
  p_rank::operator+(&local_b8,&local_98,&local_38);
  p_rank::operator+(&local_d8,&local_98,(p_rank *)&local_58);
  fold_ranks(in_RSI,(p_rank *)in_RDI);
  return in_RDI;
}

Assistant:

p_range LF(range_t rn){

		assert(rn.second >= rn.first);

		//number of A,C,T,G before start of interval
		p_rank start = BWT.parallel_rank(rn.first);

		//number of A,C,T,G before end of interval (last position of interval included)
		p_rank end;

		if(rn.second>rn.first)
			end	= BWT.parallel_rank(rn.second);
		else
			end = start;

		assert(start <= end);

		p_rank f = {F_A,F_C,F_G,F_T};
		p_rank l = f + start;
		p_rank r = f + end;

		assert(r.A <= l.C);
		assert(r.C <= l.G);
		assert(r.G <= l.T);
		assert(l.T <= n);

		return fold_ranks(l,r);

	}